

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O2

Result __thiscall
wabt::interp::Memory::Load<wabt::interp::Simd<unsigned_int,(unsigned_char)2>>
          (Memory *this,u64 offset,u64 addend,Simd<unsigned_int,_(unsigned_char)__x02_> *out)

{
  bool bVar1;
  
  bVar1 = IsValidAccess(this,offset,addend,8);
  if (bVar1) {
    *(undefined8 *)out->v =
         *(undefined8 *)
          ((this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + addend + offset);
  }
  return (Result)(uint)!bVar1;
}

Assistant:

Result Memory::Load(u64 offset, u64 addend, T* out) const {
  if (!IsValidAccess(offset, addend, sizeof(T))) {
    return Result::Error;
  }
  MemcpyEndianAware(out, data_.data(), sizeof(T), data_.size(), 0,
                    offset + addend, sizeof(T));
  return Result::Ok;
}